

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ArrayFeatureType_ShapeRange::MergeFrom
          (ArrayFeatureType_ShapeRange *this,ArrayFeatureType_ShapeRange *from)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/FeatureTypes.pb.cc"
               ,0x9f6);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
            (&(this->sizeranges_).super_RepeatedPtrFieldBase,
             &(from->sizeranges_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ArrayFeatureType_ShapeRange::MergeFrom(const ArrayFeatureType_ShapeRange& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ArrayFeatureType.ShapeRange)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  sizeranges_.MergeFrom(from.sizeranges_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}